

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O3

string * flatbuffers::ToHex<unsigned_long>
                   (string *__return_storage_ptr__,unsigned_long i,size_t width)

{
  uint *puVar1;
  long lVar2;
  string *psVar3;
  stringstream stream;
  stringstream asStack_1a8 [16];
  long local_198 [2];
  long lStack_188;
  uint auStack_180 [22];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 0x4000;
  lVar2 = *(long *)(local_198[0] + -0x18);
  if (acStack_b8[lVar2 + 1] == '\0') {
    std::ios::widen((char)asStack_1a8 + (char)lVar2 + '\x10');
    acStack_b8[lVar2 + 1] = '\x01';
  }
  acStack_b8[lVar2] = '0';
  *(long *)((long)&lStack_188 + *(long *)(local_198[0] + -0x18)) = (long)(int)width;
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  psVar3 = (string *)std::ios_base::~ios_base(local_128);
  return psVar3;
}

Assistant:

static inline std::string ToHex(T i, size_t width = sizeof(T)) {
  std::stringstream stream;
  stream << std::hex << std::uppercase << std::setfill('0')
         << std::setw(static_cast<int>(width)) << i;
  return stream.str();
}